

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QExpression.hpp
# Opt level: O0

void __thiscall Qentem::QExpression::QExpression(QExpression *this,QExpression *src)

{
  Array<Qentem::QExpression> *src_00;
  QExpression *src_local;
  QExpression *this_local;
  
  this->field_0 = (anon_union_16_3_21f97482_for_QExpression_0)0x0;
  Array<Qentem::QExpression>::Array((Array<Qentem::QExpression> *)this);
  this->Operation = src->Operation;
  this->Type = src->Type;
  if (src->Type == Variable) {
    (this->field_0).SubExpressions.storage_ = (src->field_0).SubExpressions.storage_;
  }
  else if (src->Type == SubOperation) {
    src_00 = Memory::Move<Qentem::Array<Qentem::QExpression>>((Array<Qentem::QExpression> *)src);
    Array<Qentem::QExpression>::operator=((Array<Qentem::QExpression> *)this,src_00);
  }
  else {
    (this->field_0).SubExpressions.storage_ = (src->field_0).SubExpressions.storage_;
    *(undefined8 *)((long)&this->field_0 + 8) = *(undefined8 *)((long)&src->field_0 + 8);
  }
  src->Type = Empty;
  return;
}

Assistant:

QExpression(QExpression &&src) noexcept : Operation{src.Operation}, Type{src.Type} {
        switch (src.Type) {
            case ExpressionType::Variable: {
                Variable = src.Variable;
                break;
            }

            case ExpressionType::SubOperation: {
                SubExpressions = Memory::Move(src.SubExpressions);
                break;
            }

            default: {
                Value = src.Value;
                break;
            }
        }

        src.Type = ExpressionType::Empty;
    }